

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

wchar_t reconfigure_for_term_if_necessary(_Bool update_names,player *p,equippable_summary *s)

{
  char *pcVar1;
  size_t sVar2;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t i;
  wchar_t length;
  wchar_t nrow;
  wchar_t ncol;
  wchar_t min_length;
  wchar_t result;
  equippable_summary *s_local;
  player *p_local;
  _Bool update_names_local;
  
  ncol = L'\0';
  nrow = L'\x10';
  _min_length = s;
  s_local = (equippable_summary *)p;
  p_local._3_1_ = update_names;
  Term_get_size(&length,&i);
  if ((_min_length->term_ncol == length) && (_min_length->term_nrow == i)) {
    p_local._4_4_ = ncol;
  }
  else {
    _min_length->maxpage = (i - _min_length->irow_combined_equip) + L'\xfffffffe';
    if (_min_length->maxpage < L'\x01') {
      ncol = L'\x01';
    }
    else if (((_min_length->maxpage < _min_length->npage) &&
             (_min_length->npage = _min_length->maxpage, _min_length->work_sel != L'\xffffffff')) &&
            (_min_length->npage <=
             (_min_length->work_sel - _min_length->ifirst) * _min_length->indinc)) {
      _min_length->work_sel =
           _min_length->ifirst + (_min_length->npage + L'\xffffffff') * _min_length->indinc;
    }
    local_34 = ((length - _min_length->nprop) + _min_length->propcats[4].n + -1) -
               _min_length->icol_name;
    if (local_34 < nrow) {
      local_34 = _min_length->propcats[3].n + local_34;
      if (local_34 < nrow) {
        local_34 = _min_length->propcats[2].n + local_34;
        if (local_34 < nrow) {
          ncol = L'\x01';
        }
        _min_length->nview = L'\x03';
        for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
          _min_length->propcats[local_38].nvw[0] = _min_length->propcats[local_38].n;
          _min_length->propcats[local_38].nvw[1] = L'\0';
          _min_length->propcats[local_38].nvw[2] = L'\0';
          _min_length->propcats[local_38].ivw[0] = L'\0';
          _min_length->propcats[local_38].ivw[1] = L'\0';
          _min_length->propcats[local_38].ivw[2] = L'\0';
        }
        for (local_38 = 2; local_38 < 4; local_38 = local_38 + 1) {
          _min_length->propcats[local_38].nvw[0] = L'\0';
          _min_length->propcats[local_38].nvw[1] = _min_length->propcats[local_38].n;
          _min_length->propcats[local_38].nvw[2] = L'\0';
          _min_length->propcats[local_38].ivw[0] = L'\0';
          _min_length->propcats[local_38].ivw[1] = L'\0';
          _min_length->propcats[local_38].ivw[2] = L'\0';
        }
        _min_length->propcats[4].nvw[0] = L'\0';
        _min_length->propcats[4].nvw[1] = L'\0';
        _min_length->propcats[4].nvw[2] = _min_length->propcats[4].n;
        _min_length->propcats[4].ivw[0] = L'\0';
        _min_length->propcats[4].ivw[1] = L'\0';
        _min_length->propcats[4].ivw[2] = L'\0';
      }
      else {
        _min_length->nview = L'\x02';
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          _min_length->propcats[local_38].nvw[0] = _min_length->propcats[local_38].n;
          _min_length->propcats[local_38].nvw[1] = L'\0';
          _min_length->propcats[local_38].nvw[2] = L'\0';
          _min_length->propcats[local_38].ivw[0] = L'\0';
          _min_length->propcats[local_38].ivw[1] = L'\0';
          _min_length->propcats[local_38].ivw[2] = L'\0';
        }
        for (local_38 = 3; local_38 < 5; local_38 = local_38 + 1) {
          _min_length->propcats[local_38].nvw[0] = L'\0';
          _min_length->propcats[local_38].nvw[1] = _min_length->propcats[local_38].n;
          _min_length->propcats[local_38].nvw[2] = L'\0';
          _min_length->propcats[local_38].ivw[0] = L'\0';
          _min_length->propcats[local_38].ivw[1] = L'\0';
          _min_length->propcats[local_38].ivw[2] = L'\0';
        }
      }
    }
    else {
      _min_length->nview = L'\x02';
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        _min_length->propcats[local_38].nvw[0] = _min_length->propcats[local_38].n;
        _min_length->propcats[local_38].nvw[1] = L'\0';
        _min_length->propcats[local_38].nvw[2] = L'\0';
        _min_length->propcats[local_38].ivw[0] = L'\0';
        _min_length->propcats[local_38].ivw[1] = L'\0';
        _min_length->propcats[local_38].ivw[2] = L'\0';
      }
      _min_length->propcats[4].nvw[0] = L'\0';
      _min_length->propcats[4].nvw[1] = _min_length->propcats[4].n;
      _min_length->propcats[4].nvw[2] = L'\0';
      _min_length->propcats[4].ivw[0] = L'\0';
      _min_length->propcats[4].ivw[1] = L'\0';
      _min_length->propcats[4].ivw[2] = L'\0';
    }
    if (_min_length->nview <= _min_length->iview) {
      _min_length->iview = _min_length->nview + L'\xffffffff';
    }
    if (L'\x14' < local_34) {
      local_34 = L'\x14';
    }
    if ((local_34 != _min_length->nshortnm) && ((p_local._3_1_ & 1) != 0)) {
      for (local_38 = L'\0'; local_38 < _min_length->nitems; local_38 = local_38 + L'\x01') {
        string_free(_min_length->items[local_38].short_name);
        pcVar1 = set_short_name(_min_length->items[local_38].obj,(long)local_34,(player *)s_local);
        _min_length->items[local_38].short_name = pcVar1;
        sVar2 = strlen(_min_length->items[local_38].short_name);
        _min_length->items[local_38].nmlen = (wchar_t)sVar2;
      }
    }
    _min_length->nshortnm = local_34;
    _min_length->term_ncol = length;
    _min_length->term_nrow = i;
    p_local._4_4_ = ncol;
  }
  return p_local._4_4_;
}

Assistant:

static int reconfigure_for_term_if_necessary(bool update_names,
	const struct player *p, struct equippable_summary *s)
{
	int result = 0;
	int min_length = 16;
	int ncol, nrow, length, i;

	Term_get_size(&ncol, &nrow);
	if (s->term_ncol == ncol && s->term_nrow == nrow) {
		return result;
	}

	/*
	 * Have s->irow_combined_equip + 1 rows of a header and one row, for
	 * prompts, of a footer.
	 */
	s->maxpage = nrow - s->irow_combined_equip - 2;
	if (s->maxpage < 1) {
		result = 1;
	} else if (s->npage > s->maxpage) {
		s->npage = s->maxpage;
		if (s->work_sel != -1 &&
			(s->work_sel - s->ifirst) * s->indinc >= s->npage) {
			s->work_sel = s->ifirst + (s->npage - 1) * s->indinc;
		}
	}

	/*
	 * Leave a space between the name and the properties.  Don't include
	 * the core stat modifiers in the first view.
	 */
	length = ncol - s->nprop + s->propcats[N_ELEMENTS(s->propcats) - 1].n -
		1 - s->icol_name;
	if (length < min_length) {
		/* Try shifting the other modifiers to the second view. */
		length += s->propcats[N_ELEMENTS(s->propcats) - 2].n;
		if (length < min_length) {
			/* Try a three view layout. */
			length += s->propcats[N_ELEMENTS(s->propcats) - 3].n;
			if (length < min_length) {
				/* Give up. */
				result = 1;
			}
			s->nview = 3;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 3; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 3;
				i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] =
				s->propcats[N_ELEMENTS(s->propcats) - 1].n;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
		} else {
			s->nview = 2;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 2; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 2;
				i < (int)N_ELEMENTS(s->propcats); ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
		}
	} else {
		s->nview = 2;
		for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
			s->propcats[i].nvw[0] = s->propcats[i].n;
			s->propcats[i].nvw[1] = 0;
			s->propcats[i].nvw[2] = 0;
			s->propcats[i].ivw[0] = 0;
			s->propcats[i].ivw[1] = 0;
			s->propcats[i].ivw[2] = 0;
		}
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] =
			s->propcats[N_ELEMENTS(s->propcats) - 1].n;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
	}
	if (s->iview >= s->nview) {
		s->iview = s->nview - 1;
	}
	if (length > 20) {
		length = 20;
	}
	if (length != s->nshortnm && update_names) {
		for (i = 0; i < s->nitems; ++i) {
			string_free(s->items[i].short_name);
			s->items[i].short_name =
				set_short_name(s->items[i].obj, length, p);
			s->items[i].nmlen =
				(int)strlen(s->items[i].short_name);
		}
	}
	s->nshortnm = length;

	s->term_ncol = ncol;
	s->term_nrow = nrow;

	return result;
}